

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TFunction::dump(TFunction *this,TInfoSink *infoSink,bool complete)

{
  pointer pTVar1;
  TType *this_00;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar6;
  undefined4 extraout_var_01;
  long lVar7;
  undefined7 in_register_00000011;
  TInfoSinkBase *this_01;
  ulong uVar8;
  long lVar9;
  char *s;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  TInfoSinkBase *this_02;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  pool_allocator<char> in_stack_fffffffffffffe70;
  pool_allocator<char> local_188;
  pool_allocator<char> local_180;
  pool_allocator<char> local_178;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_170;
  TString local_148;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f8;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  this_01 = &infoSink->debug;
  iVar3 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
  TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var,iVar3) + 8));
  TInfoSinkBase::append(this_01,": ");
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    TType::getBasicTypeString_abi_cxx11_(&local_148,&this->returnType);
    TInfoSinkBase::append(this_01,&local_148);
    TInfoSinkBase::append(this_01," ");
    iVar3 = (*(this->super_TSymbol)._vptr_TSymbol[6])(this);
    TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var_01,iVar3) + 8));
    TInfoSinkBase::append(this_01,"n");
  }
  else {
    local_170._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_58,"",(pool_allocator<char> *)&local_170);
    local_f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_80,"",(pool_allocator<char> *)&local_f8);
    uVar8 = 0;
    name._M_dataplus._M_p = (pointer)local_80;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
    name._M_string_length = in_stack_fffffffffffffe38;
    name.field_2._M_allocated_capacity = in_stack_fffffffffffffe40;
    name.field_2._8_8_ = in_stack_fffffffffffffe48;
    structName._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
    structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName._M_string_length = in_stack_fffffffffffffe60;
    structName.field_2._M_allocated_capacity = in_stack_fffffffffffffe68;
    structName.field_2._8_8_ = in_stack_fffffffffffffe70.allocator;
    TType::getCompleteString(&local_148,&this->returnType,false,true,true,true,name,structName);
    TInfoSinkBase::append(this_01,&local_148);
    TInfoSinkBase::append(this_01," ");
    iVar3 = (*(this->super_TSymbol)._vptr_TSymbol[3])(this);
    TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var_00,iVar3) + 8));
    TInfoSinkBase::append(this_01,"(");
    uVar4 = (*(this->super_TSymbol)._vptr_TSymbol[0x24])(this);
    lVar7 = (long)(int)(uVar4 - 1);
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    lVar9 = 8;
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      pTVar1 = (this->parameters).
               super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
               super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = *(TType **)((long)&pTVar1->name + lVar9);
      local_178.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_d0,"",&local_178);
      local_180.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_a8,"",&local_180);
      name_00._M_dataplus._M_p = (pointer)local_a8;
      name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_d0;
      name_00._M_string_length = in_stack_fffffffffffffe38;
      name_00.field_2._M_allocated_capacity = (size_type)this_01;
      name_00.field_2._8_8_ = uVar8;
      structName_00._M_dataplus._M_p = (pointer)lVar7;
      structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
      structName_00._M_string_length = (size_type)this;
      structName_00.field_2._M_allocated_capacity = uVar5;
      structName_00.field_2._8_8_ = in_stack_fffffffffffffe70.allocator;
      TType::getCompleteString(&local_148,this_00,false,true,true,true,name_00,structName_00);
      this_02 = this_01;
      TInfoSinkBase::append(this_01,&local_148);
      TInfoSinkBase::append(this_01," ");
      cVar2 = (**(code **)(**(long **)((long)&pTVar1->name + lVar9) + 0x128))();
      if (cVar2 == '\0') {
        local_188.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_170,"",&local_188);
      }
      else {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(**(long **)((long)&pTVar1->name + lVar9) + 0x28))();
        std::operator+(&local_f8,"of ",pbVar6);
        std::operator+(&local_170,&local_f8," ");
      }
      TInfoSinkBase::append(this_02,&local_170);
      pbVar6 = *(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> **)
                ((long)pTVar1 + lVar9 + -8);
      if (pbVar6 == (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    0x0) {
        in_stack_fffffffffffffe70.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_120,"",(pool_allocator<char> *)&stack0xfffffffffffffe70);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        basic_string(&local_120,pbVar6);
      }
      s = "";
      this_01 = this_02;
      TInfoSinkBase::append(this_02,&local_120);
      if ((long)uVar8 < lVar7) {
        s = ",";
      }
      TInfoSinkBase::append(this_02,s);
      lVar9 = lVar9 + 0x18;
    }
    TInfoSinkBase::append(this_01,")");
    TSymbol::dumpExtensions(&this->super_TSymbol,infoSink);
  }
  TInfoSinkBase::append(this_01,"\n");
  return;
}

Assistant:

void TFunction::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << returnType.getCompleteString() << " " << getName().c_str()
                       << "(";

        int numParams = getParamCount();
        for (int i = 0; i < numParams; i++) {
            const TParameter &param = parameters[i];
            infoSink.debug << param.type->getCompleteString() << " "
                           << (param.type->isStruct() ? "of " + param.type->getTypeName() + " " : "")
                           << (param.name ? *param.name : "") << (i < numParams - 1 ? "," : "");
        }

        infoSink.debug << ")";
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << returnType.getBasicTypeString() << " "
                       << getMangledName().c_str() << "n";
    }

    infoSink.debug << "\n";
}